

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c++
# Opt level: O0

Exception * kj::Timer::makeTimeoutException(void)

{
  char (*in_RCX) [20];
  Exception *in_RDI;
  String local_28;
  
  kj::_::Debug::makeDescription<char_const(&)[20]>
            (&local_28,(Debug *)"\"operation timed out\"","operation timed out",in_RCX);
  Exception::Exception
            (in_RDI,OVERLOADED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/timer.c++"
             ,0x1e,&local_28);
  String::~String(&local_28);
  return in_RDI;
}

Assistant:

kj::Exception Timer::makeTimeoutException() {
  return KJ_EXCEPTION(OVERLOADED, "operation timed out");
}